

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MergedDescriptorDatabaseTest_FindFileContainingSymbol_Test::
~MergedDescriptorDatabaseTest_FindFileContainingSymbol_Test
          (MergedDescriptorDatabaseTest_FindFileContainingSymbol_Test *this)

{
  (this->super_MergedDescriptorDatabaseTest).super_Test._vptr_Test =
       (_func_int **)&PTR__MergedDescriptorDatabaseTest_01876228;
  MergedDescriptorDatabase::~MergedDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).reverse_merged_);
  MergedDescriptorDatabase::~MergedDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).forward_merged_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).database2_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_MergedDescriptorDatabaseTest).database1_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x120);
  return;
}

Assistant:

TEST_F(MergedDescriptorDatabaseTest, FindFileContainingSymbol) {
  {
    // Can find file that is only in database1_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingSymbol("Foo", &file));
    EXPECT_EQ("foo.proto", file.name());
    ExpectContainsType(file, "Foo");
  }

  {
    // Can find file that is only in database2_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingSymbol("Bar", &file));
    EXPECT_EQ("bar.proto", file.name());
    ExpectContainsType(file, "Bar");
  }

  {
    // In forward_merged_, database1_'s baz.proto takes precedence.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingSymbol("Baz", &file));
    EXPECT_EQ("baz.proto", file.name());
    ExpectContainsType(file, "FromPool1");
  }

  {
    // In reverse_merged_, database2_'s baz.proto takes precedence.
    FileDescriptorProto file;
    EXPECT_TRUE(reverse_merged_.FindFileContainingSymbol("Baz", &file));
    EXPECT_EQ("baz.proto", file.name());
    ExpectContainsType(file, "FromPool2");
  }

  {
    // FromPool1 only shows up in forward_merged_ because it is masked by
    // database2_'s baz.proto in reverse_merged_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingSymbol("FromPool1", &file));
    EXPECT_FALSE(reverse_merged_.FindFileContainingSymbol("FromPool1", &file));
  }

  {
    // Can't find non-existent symbol.
    FileDescriptorProto file;
    EXPECT_FALSE(forward_merged_.FindFileContainingSymbol("NoSuchType", &file));
  }
}